

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::internal::MapFieldBase::SetMapDirty(MapFieldBase *this)

{
  ReflectionPayload *pRVar1;
  ReflectionPayload *p;
  MapFieldBase *this_local;
  
  MutableAccess(this);
  pRVar1 = maybe_payload(this);
  if (pRVar1 != (ReflectionPayload *)0x0) {
    std::atomic<google::protobuf::internal::MapFieldBase::State>::store
              (&pRVar1->state,STATE_MODIFIED_MAP,memory_order_relaxed);
  }
  return;
}

Assistant:

void SetMapDirty() {
    MutableAccess();
    // These are called by (non-const) mutator functions. So by our API it's the
    // callers responsibility to have these calls properly ordered.
    if (auto* p = maybe_payload()) {
      // If we don't have a payload, it is already assumed `STATE_MODIFIED_MAP`.
      p->state.store(STATE_MODIFIED_MAP, std::memory_order_relaxed);
    }
  }